

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O3

uint aom_highbd_12_obmc_variance8x4_c
               (uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  lVar4 = (long)pre * 2;
  lVar3 = 0;
  lVar5 = 0;
  iVar6 = 0;
  do {
    lVar7 = 0;
    do {
      iVar1 = wsrc[lVar7] - (uint)*(ushort *)(lVar4 + lVar7 * 2) * mask[lVar7];
      if (iVar1 < 0) {
        uVar2 = -(0x800U - iVar1 >> 0xc);
      }
      else {
        uVar2 = iVar1 + 0x800U >> 0xc;
      }
      lVar3 = lVar3 + (int)uVar2;
      lVar5 = lVar5 + (ulong)(uVar2 * uVar2);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    wsrc = wsrc + 8;
    mask = mask + 8;
    iVar6 = iVar6 + 1;
    lVar4 = lVar4 + (long)pre_stride * 2;
  } while (iVar6 != 4);
  uVar2 = (uint)((ulong)(lVar5 + 0x80) >> 8);
  *sse = uVar2;
  lVar4 = lVar3 * 0x10000000 + 0x80000000 >> 0x20;
  lVar4 = (ulong)uVar2 - ((ulong)(lVar4 * lVar4) >> 5);
  uVar2 = (uint)lVar4;
  if (lVar4 < 0) {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static inline void highbd_obmc_variance64(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          uint64_t *sse, int64_t *sum) {
  int i, j;
  uint16_t *pre = CONVERT_TO_SHORTPTR(pre8);
  uint64_t tsse = 0;
  int64_t tsum = 0;

  for (i = 0; i < h; i++) {
    for (j = 0; j < w; j++) {
      int diff = ROUND_POWER_OF_TWO_SIGNED(wsrc[j] - pre[j] * mask[j], 12);
      tsum += diff;
      tsse += diff * diff;
    }

    pre += pre_stride;
    wsrc += w;
    mask += w;
  }
  *sse = tsse;
  *sum = tsum;
}